

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O1

bool __thiscall
sptk::ScalarOperation::AddMagicNumberReplacer(ScalarOperation *this,double replacement_number)

{
  pointer *pppMVar1;
  bool bVar2;
  iterator __position;
  ModuleInterface *local_18;
  
  bVar2 = this->use_magic_number_;
  if (bVar2 == true) {
    local_18 = (ModuleInterface *)operator_new(0x10);
    local_18->_vptr_ModuleInterface = (_func_int **)&PTR__ModuleInterface_00114ca8;
    local_18[1]._vptr_ModuleInterface = (_func_int **)replacement_number;
    __position._M_current =
         (this->modules_).
         super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->modules_).
        super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<sptk::ScalarOperation::ModuleInterface*,std::allocator<sptk::ScalarOperation::ModuleInterface*>>
      ::_M_realloc_insert<sptk::ScalarOperation::ModuleInterface*>
                ((vector<sptk::ScalarOperation::ModuleInterface*,std::allocator<sptk::ScalarOperation::ModuleInterface*>>
                  *)&this->modules_,__position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      pppMVar1 = &(this->modules_).
                  super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppMVar1 = *pppMVar1 + 1;
    }
    this->use_magic_number_ = false;
  }
  return bVar2;
}

Assistant:

bool ScalarOperation::AddMagicNumberReplacer(double replacement_number) {
  if (!use_magic_number_) return false;
  modules_.push_back(new MagicNumberReplacer(replacement_number));
  use_magic_number_ = false;
  return true;
}